

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O0

void __thiscall iutest::detail::ParamTestSuiteHolder::RegisterTests(ParamTestSuiteHolder *this)

{
  bool bVar1;
  reference ppIVar2;
  __normal_iterator<iutest::detail::IParamTestSuiteInfo_*const_*,_std::vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>_>
  local_20;
  __normal_iterator<iutest::detail::IParamTestSuiteInfo_*const_*,_std::vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>_>
  local_18;
  const_iterator it;
  ParamTestSuiteHolder *this_local;
  
  it._M_current = (IParamTestSuiteInfo **)this;
  local_18._M_current =
       (IParamTestSuiteInfo **)
       std::
       vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>
       ::begin(&this->m_testsuite_infos);
  while( true ) {
    local_20._M_current =
         (IParamTestSuiteInfo **)
         std::
         vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>
         ::end(&this->m_testsuite_infos);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<iutest::detail::IParamTestSuiteInfo_*const_*,_std::vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>_>
              ::operator*(&local_18);
    IParamTestSuiteInfo::RegisterTests(*ppIVar2);
    __gnu_cxx::
    __normal_iterator<iutest::detail::IParamTestSuiteInfo_*const_*,_std::vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void RegisterTests() const
    {
        for( TestSuiteInfoContainer::const_iterator it = m_testsuite_infos.begin(); it != m_testsuite_infos.end(); ++it)
        {
            (*it)->RegisterTests();
        }
    }